

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# residue.cpp
# Opt level: O0

void Residue::InitPar(char *parFile,string *dir)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  pointer ppVar6;
  reference pvVar7;
  void *this;
  ulong uVar8;
  pointer ppVar9;
  size_type sVar10;
  double dVar11;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_bool>
  pVar12;
  _Self local_608;
  _Base_ptr local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8 [32];
  _Base_ptr local_5d8;
  undefined1 local_5d0;
  int local_5c4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_5c0;
  _Base_ptr local_598;
  undefined1 local_590;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_588;
  _Self local_560;
  _Base_ptr local_558;
  int local_550;
  int AtomIndex;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_540;
  iterator siItr;
  iterator aaItr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strVec;
  char tmpLine [500];
  char local_318 [8];
  char tempCh [200];
  string tmpStr;
  long local_230;
  ifstream inFile;
  int local_28;
  value_type local_24;
  int numLine;
  int tmpInt;
  int j;
  int i;
  string *dir_local;
  char *parFile_local;
  
  _j = dir;
  dir_local = (string *)parFile;
  std::ifstream::ifstream(&local_230);
  std::__cxx11::string::string((string *)(tempCh + 0xc0));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&aaItr);
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree_iterator((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&siItr);
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::_Rb_tree_iterator(&local_540);
  std::ifstream::open((char *)&local_230,(_Ios_Openmode)dir_local);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    strcpy(local_318,pcVar4);
    strcat(local_318,(char *)dir_local);
    std::ifstream::open((char *)&local_230,(_Ios_Openmode)local_318);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"cannot open parameter file ");
      poVar5 = std::operator<<(poVar5,local_318);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      exit(0);
    }
  }
  std::ios::clear((long)&local_230 + *(long *)(local_230 + -0x18),0);
  std::istream::seekg((long)&local_230,_S_beg);
  do {
    while( true ) {
      bVar1 = std::ios::eof();
      if (((bVar1 ^ 0xff) & 1) == 0) {
        bb_size = 1.93;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&aaItr);
        std::__cxx11::string::~string((string *)(tempCh + 0xc0));
        std::ifstream::~ifstream(&local_230);
        return;
      }
      std::istream::getline
                ((char *)&local_230,
                 (long)&strVec.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __isoc99_sscanf(&strVec.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,"%*s %s %d",local_318,
                      &local_28);
      iVar3 = strcmp(local_318,"restype");
      if (iVar3 == 0) break;
      iVar3 = strcmp(local_318,"atomDependency");
      if (iVar3 == 0) {
        for (tmpInt = 0; tmpInt < local_28; tmpInt = tmpInt + 1) {
          std::istream::getline
                    ((char *)&local_230,
                     (long)&strVec.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::operator=
                    ((string *)(tempCh + 0xc0),
                     (char *)&strVec.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&aaItr);
          split((string *)(tempCh + 0xc0),' ',
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aaItr);
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&aaItr,1);
          bVar2 = std::operator!=(pvVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)(Name1_abi_cxx11_ + (long)tmpInt * 0x20));
          if (bVar2) {
            poVar5 = std::operator<<((ostream *)&std::cout,"atomDependency error, wrong AA type ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,tmpInt);
            poVar5 = std::operator<<(poVar5," ");
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&aaItr,1);
            pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar7);
            poVar5 = std::operator<<(poVar5,*pcVar4);
            poVar5 = std::operator<<(poVar5," ");
            poVar5 = std::operator<<(poVar5,(string *)(Name1_abi_cxx11_ + (long)tmpInt * 0x20));
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            exit(0);
          }
          local_24 = 2;
          for (numLine = 0; numLine < numAtom[tmpInt]; numLine = numLine + 1) {
            sVar10 = (size_type)local_24;
            local_24 = local_24 + 1;
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&aaItr,sVar10);
            bVar2 = std::operator!=(pvVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)(cType_abi_cxx11_ +
                                              (long)numLine * 0x20 + (long)tmpInt * 0x3c0));
            if (bVar2) {
              poVar5 = std::operator<<((ostream *)&std::cout,
                                       "atomDependency error, wrong atom type ");
              pvVar7 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&aaItr,(long)local_24);
              poVar5 = std::operator<<(poVar5,(string *)pvVar7);
              poVar5 = std::operator<<(poVar5," ");
              poVar5 = std::operator<<(poVar5,(string *)
                                              (cType_abi_cxx11_ +
                                              (long)numLine * 0x20 + (long)tmpInt * 0x3c0));
              poVar5 = std::operator<<(poVar5," ");
              this = (void *)std::ostream::operator<<(poVar5,tmpInt);
              std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
              exit(0);
            }
            sVar10 = (size_type)local_24;
            local_24 = local_24 + 1;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&aaItr,sVar10);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            iVar3 = atoi(pcVar4);
            prev_atom[tmpInt][numLine][0] = iVar3;
            sVar10 = (size_type)local_24;
            local_24 = local_24 + 1;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&aaItr,sVar10);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            iVar3 = atoi(pcVar4);
            prev_atom[tmpInt][numLine][1] = iVar3;
            sVar10 = (size_type)local_24;
            local_24 = local_24 + 1;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&aaItr,sVar10);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            iVar3 = atoi(pcVar4);
            prev_atom[tmpInt][numLine][2] = iVar3;
          }
        }
      }
      else {
        iVar3 = strcmp(local_318,"bondParameter");
        if (iVar3 == 0) {
          for (tmpInt = 0; tmpInt < local_28; tmpInt = tmpInt + 1) {
            std::istream::getline
                      ((char *)&local_230,
                       (long)&strVec.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=
                      ((string *)(tempCh + 0xc0),
                       (char *)&strVec.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&aaItr);
            split((string *)(tempCh + 0xc0),' ',
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&aaItr);
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&aaItr,1);
            bVar2 = std::operator!=(pvVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)(Name1_abi_cxx11_ + (long)tmpInt * 0x20));
            if (bVar2) {
              poVar5 = std::operator<<((ostream *)&std::cout,"bondParameter error, wrong AA type ");
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,tmpInt);
              poVar5 = std::operator<<(poVar5," ");
              pvVar7 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&aaItr,1);
              pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar7);
              poVar5 = std::operator<<(poVar5,*pcVar4);
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              exit(0);
            }
            local_24 = 2;
            for (numLine = 0; numLine < numAtom[tmpInt]; numLine = numLine + 1) {
              sVar10 = (size_type)local_24;
              local_24 = local_24 + 1;
              pvVar7 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&aaItr,sVar10);
              bVar2 = std::operator!=(pvVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)(cType_abi_cxx11_ +
                                                (long)numLine * 0x20 + (long)tmpInt * 0x3c0));
              if (bVar2) {
                poVar5 = std::operator<<((ostream *)&std::cout,
                                         "bondParamter error, wrong atom type ");
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_24);
                poVar5 = std::operator<<(poVar5," ");
                pvVar7 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)&aaItr,(long)(local_24 + -1));
                poVar5 = std::operator<<(poVar5,(string *)pvVar7);
                poVar5 = std::operator<<(poVar5," ");
                poVar5 = std::operator<<(poVar5,(string *)
                                                (cType_abi_cxx11_ +
                                                (long)numLine * 0x20 + (long)tmpInt * 0x3c0));
                std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                exit(0);
              }
              sVar10 = (size_type)local_24;
              local_24 = local_24 + 1;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&aaItr,sVar10);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              dVar11 = atof(pcVar4);
              bond_length[tmpInt][numLine] = dVar11;
              sVar10 = (size_type)local_24;
              local_24 = local_24 + 1;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&aaItr,sVar10);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              dVar11 = atof(pcVar4);
              bond_angle[tmpInt][numLine] = dVar11 * 0.017453292519943278;
            }
          }
        }
        else {
          iVar3 = strcmp(local_318,"residueSize");
          if (iVar3 == 0) {
            for (tmpInt = 0; tmpInt < local_28; tmpInt = tmpInt + 1) {
              std::istream::getline
                        ((char *)&local_230,
                         (long)&strVec.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::__cxx11::string::operator=
                        ((string *)(tempCh + 0xc0),
                         (char *)&strVec.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&aaItr);
              split((string *)(tempCh + 0xc0),' ',
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&aaItr);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&aaItr,2);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              dVar11 = atof(pcVar4);
              size[tmpInt] = dVar11;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&aaItr,4);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              dVar11 = atof(pcVar4);
              sc_size[tmpInt] = dVar11;
            }
          }
          else {
            iVar3 = strcmp(local_318,"torsionAngle");
            if (iVar3 == 0) {
              for (tmpInt = 0; tmpInt < local_28; tmpInt = tmpInt + 1) {
                std::istream::getline
                          ((char *)&local_230,
                           (long)&strVec.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
                std::__cxx11::string::operator=
                          ((string *)(tempCh + 0xc0),
                           (char *)&strVec.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&aaItr);
                split((string *)(tempCh + 0xc0),' ',
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&aaItr);
                local_24 = 2;
                for (numLine = 0; numLine < numAtom[tmpInt]; numLine = numLine + 1) {
                  sVar10 = (size_type)local_24;
                  local_24 = local_24 + 1;
                  pvVar7 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)&aaItr,sVar10);
                  bVar2 = std::operator!=(pvVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(cType_abi_cxx11_ +
                                                    (long)numLine * 0x20 + (long)tmpInt * 0x3c0));
                  if (bVar2) {
                    poVar5 = std::operator<<((ostream *)&std::cout,
                                             "torsionAngle error, wrong atom type ");
                    pvVar7 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)&aaItr,(long)(local_24 + -1));
                    poVar5 = std::operator<<(poVar5,(string *)pvVar7);
                    poVar5 = std::operator<<(poVar5," ");
                    poVar5 = std::operator<<(poVar5,(string *)
                                                    (cType_abi_cxx11_ +
                                                    (long)numLine * 0x20 + (long)tmpInt * 0x3c0));
                    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                    exit(0);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&aaItr,(long)local_24);
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  dVar11 = atof(pcVar4);
                  if ((dVar11 != -1234.0) || (NAN(dVar11))) {
                    sVar10 = (size_type)local_24;
                    local_24 = local_24 + 1;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&aaItr,sVar10);
                    pcVar4 = (char *)std::__cxx11::string::c_str();
                    dVar11 = atof(pcVar4);
                    torsion[tmpInt][numLine] = dVar11 * 0.017453292519943278;
                  }
                  else {
                    torsion[tmpInt][numLine] = -1234.0;
                    local_24 = local_24 + 1;
                  }
                }
              }
            }
            else {
              iVar3 = strcmp(local_318,"functionalAtoms");
              if (iVar3 == 0) {
                for (tmpInt = 0; tmpInt < local_28; tmpInt = tmpInt + 1) {
                  std::istream::getline
                            ((char *)&local_230,
                             (long)&strVec.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  std::__cxx11::string::operator=
                            ((string *)(tempCh + 0xc0),
                             (char *)&strVec.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&aaItr);
                  split((string *)(tempCh + 0xc0),' ',
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&aaItr);
                  local_24 = 2;
                  for (numLine = 2; uVar8 = (ulong)numLine,
                      sVar10 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)&aaItr), uVar8 < sVar10; numLine = numLine + 1) {
                    pvVar7 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)&aaItr,0);
                    std::__cxx11::string::operator=((string *)(tempCh + 0xc0),(string *)pvVar7);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&aaItr,(long)numLine);
                    std::operator+(local_5f8,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(tempCh + 0xc0));
                    std::__cxx11::string::operator=((string *)(tempCh + 0xc0),(string *)local_5f8);
                    std::__cxx11::string::~string((string *)local_5f8);
                    local_600 = (_Base_ptr)
                                std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                ::find(&AtomMap_abi_cxx11_,(key_type *)(tempCh + 0xc0));
                    local_540._M_node = local_600;
                    local_608._M_node =
                         (_Base_ptr)
                         std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         ::end(&AtomMap_abi_cxx11_);
                    bVar2 = std::operator==(&local_540,&local_608);
                    if (bVar2) {
                      poVar5 = std::operator<<((ostream *)&std::cout,
                                               "atom type error in reading functional atoms! ");
                      poVar5 = (ostream *)std::ostream::operator<<(poVar5,tmpInt);
                      poVar5 = std::operator<<(poVar5," ");
                      poVar5 = (ostream *)std::ostream::operator<<(poVar5,numLine);
                      poVar5 = std::operator<<(poVar5," ");
                      poVar5 = std::operator<<(poVar5,(string *)(tempCh + 0xc0));
                      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                      exit(0);
                    }
                    ppVar9 = std::
                             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                             ::operator->(&local_540);
                    local_24 = ppVar9->second;
                    std::vector<int,_std::allocator<int>_>::push_back(funcAtom + tmpInt,&local_24);
                  }
                }
              }
            }
          }
        }
      }
    }
    local_550 = 0;
    for (tmpInt = 0; tmpInt < local_28; tmpInt = tmpInt + 1) {
      std::istream::getline
                ((char *)&local_230,
                 (long)&strVec.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::operator=
                ((string *)(tempCh + 0xc0),
                 (char *)&strVec.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&aaItr);
      iVar3 = split((string *)(tempCh + 0xc0),' ',
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&aaItr);
      numAtom[tmpInt] = (iVar3 + -2) - (iVar3 + -2 >> 0x1f) >> 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&aaItr,0);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::__cxx11::string::operator=((string *)(Name1_abi_cxx11_ + (long)tmpInt * 0x20),pcVar4);
      std::__cxx11::string::operator=
                ((string *)(tempCh + 0xc0),(string *)(Name1_abi_cxx11_ + (long)tmpInt * 0x20));
      local_558 = (_Base_ptr)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::find(&AAMap_abi_cxx11_,(key_type *)(tempCh + 0xc0));
      siItr._M_node = local_558;
      local_560._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(&AAMap_abi_cxx11_);
      bVar2 = std::operator==((_Self *)&siItr,&local_560);
      if (bVar2) {
        poVar5 = std::operator<<((ostream *)&std::cout,"file reading error, wrong AA type ");
        poVar5 = std::operator<<(poVar5,(string *)(tempCh + 0xc0));
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        exit(0);
      }
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&siItr);
      std::__cxx11::string::operator=
                ((string *)(Name3_abi_cxx11_ + (long)tmpInt * 0x20),(string *)&ppVar6->second);
      local_24 = 2;
      for (numLine = 0; numLine < numAtom[tmpInt]; numLine = numLine + 1) {
        sVar10 = (size_type)local_24;
        local_24 = local_24 + 1;
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&aaItr,sVar10);
        std::__cxx11::string::operator=
                  ((string *)(cType_abi_cxx11_ + (long)numLine * 0x20 + (long)tmpInt * 0x3c0),
                   (string *)pvVar7);
        sVar10 = (size_type)local_24;
        local_24 = local_24 + 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&aaItr,sVar10);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        iVar3 = atoi(pcVar4);
        vdwType[tmpInt][numLine] = iVar3;
        std::__cxx11::string::operator=
                  ((string *)(tempCh + 0xc0),(string *)(Name1_abi_cxx11_ + (long)tmpInt * 0x20));
        std::__cxx11::string::operator+=
                  ((string *)(tempCh + 0xc0),
                   (string *)(cType_abi_cxx11_ + (long)numLine * 0x20 + (long)tmpInt * 0x3c0));
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int_&,_true>
                  (&local_588,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (tempCh + 0xc0),&numLine);
        pVar12 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::insert(&AtomMap_abi_cxx11_,&local_588);
        local_598 = (_Base_ptr)pVar12.first._M_node;
        local_590 = pVar12.second;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
        ::~pair(&local_588);
        local_5c4 = local_550;
        local_550 = local_550 + 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_true>
                  (&local_5c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (tempCh + 0xc0),&local_5c4);
        pVar12 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::insert(&AtomIndexMap_abi_cxx11_,&local_5c0);
        local_5d8 = (_Base_ptr)pVar12.first._M_node;
        local_5d0 = pVar12.second;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
        ::~pair(&local_5c0);
      }
    }
  } while( true );
}

Assistant:

void Residue::InitPar(char *parFile, string &dir) {
    int i, j, tmpInt, numLine;
    ifstream inFile;
    string tmpStr;
    char tempCh[200], tmpLine[500];
    vector<string> strVec;       // used in reading files
    SSMAP::iterator aaItr;
    SIMAP::iterator siItr;

    inFile.open(parFile, ios::in);
    if (!inFile.is_open()) {
        strcpy(tempCh, dir.c_str());
        strcat(tempCh, parFile);
        inFile.open(tempCh, ios::in);
        if (!inFile.is_open()) {
            cout << "cannot open parameter file " << tempCh << endl;
            exit(0);
        }
    }

    // read parameters
    inFile.clear();
    inFile.seekg(0, ios::beg);
    while (!inFile.eof()) {
        inFile.getline(tmpLine, 1000);
        sscanf(tmpLine, "%*s %s %d", tempCh, &numLine);
        if (strcmp(tempCh, "restype") == 0) { // read residue types
            int AtomIndex = 0;
            for (i = 0; i < numLine; ++i) {
                inFile.getline(tmpLine, 1000);
                tmpStr = tmpLine;
                strVec.clear();
                Residue::numAtom[i] = (split(tmpStr, ' ', strVec) - 2) / 2;
                Name1[i] = strVec[0].c_str();
                tmpStr = Name1[i];
                if ((aaItr = AAMap.find(tmpStr)) == AAMap.end()) {
                    cout << "file reading error, wrong AA type " << tmpStr << endl;
                    exit(0);
                }
                else {
                    Name3[i] = aaItr->second;
                }
                tmpInt = 2;
                for (j = 0; j < Residue::numAtom[i]; ++j) {
                    Residue::cType[i][j] = strVec[tmpInt++];
                    Residue::vdwType[i][j] = atoi(strVec[tmpInt++].c_str());
                    tmpStr = Name1[i];
                    tmpStr += Residue::cType[i][j];
                    Residue::AtomMap.insert(SIMAP::value_type(tmpStr, j));
                    Residue::AtomIndexMap.insert(SIMAP::value_type(tmpStr, AtomIndex++));
                }
            }
        }
        else if (strcmp(tempCh, "atomDependency") == 0) {
            for (i = 0; i < numLine; ++i) {
                inFile.getline(tmpLine, 1000);
                tmpStr = tmpLine;
                strVec.clear();
                split(tmpStr, ' ', strVec);
                if (strVec[1] != Residue::Name1[i]) {
                    cout << "atomDependency error, wrong AA type " << i << " " << strVec[1][0] << " " <<
                    Residue::Name1[i] << endl;
                    exit(0);
                }
                // read the atom dependency data for each atom
                tmpInt = 2;
                for (j = 0; j < Residue::numAtom[i]; ++j) {
                    if (strVec[tmpInt++] != Residue::cType[i][j]) {
                        cout << "atomDependency error, wrong atom type " << strVec[tmpInt] << " " <<
                        Residue::cType[i][j] << " " << i << endl;
                        exit(0);
                    }
                    // read the next three integers
                    Residue::prev_atom[i][j][0] = atoi(strVec[tmpInt++].c_str());
                    Residue::prev_atom[i][j][1] = atoi(strVec[tmpInt++].c_str());
                    Residue::prev_atom[i][j][2] = atoi(strVec[tmpInt++].c_str());
                }
            }
        }
        else if (strcmp(tempCh, "bondParameter") == 0) {
            for (i = 0; i < numLine; ++i) {
                inFile.getline(tmpLine, 1000);
                tmpStr = tmpLine;
                strVec.clear();
                split(tmpStr, ' ', strVec);
                if (strVec[1] != Name1[i]) {
                    cout << "bondParameter error, wrong AA type " << i << " " << strVec[1][0] << endl;
                    exit(0);
                }
                // read the bond parameters
                tmpInt = 2;
                for (j = 0; j < numAtom[i]; ++j) {
                    if (strVec[tmpInt++] != cType[i][j]) {
                        cout << "bondParamter error, wrong atom type " << tmpInt << " " << strVec[tmpInt - 1] << " " <<
                        cType[i][j] << endl;
                        exit(0);
                    }
                    // read the next two double numbers
                    bond_length[i][j] = atof(strVec[tmpInt++].c_str());
                    bond_angle[i][j] = (PI / 180) * atof(strVec[tmpInt++].c_str());
                }
            }
        }
        else if (strcmp(tempCh, "residueSize") == 0) {
            for (i = 0; i < numLine; ++i) {
                inFile.getline(tmpLine, 1000);
                tmpStr = tmpLine;
                strVec.clear();
                split(tmpStr, ' ', strVec);
                size[i] = atof(strVec[2].c_str());
                sc_size[i] = atof(strVec[4].c_str());
            }
        }
        else if (strcmp(tempCh, "torsionAngle") == 0) {
            for (i = 0; i < numLine; ++i) {
                inFile.getline(tmpLine, 1000);
                tmpStr = tmpLine;
                strVec.clear();
                split(tmpStr, ' ', strVec);
                tmpInt = 2;
                for (j = 0; j < numAtom[i]; ++j) {
                    if (strVec[tmpInt++] != cType[i][j]) {
                        std::cout << "torsionAngle error, wrong atom type " << strVec[tmpInt - 1] << " " << cType[i][j] <<
                        endl;
                        exit(0);
                    }
                    if (atof(strVec[tmpInt].c_str()) == -1234) {
                        torsion[i][j] = -1234;
                        tmpInt++;
                    }
                    else
                        torsion[i][j] = (PI / 180) * atof(strVec[tmpInt++].c_str());
                }
            }
        }
        else if (strcmp(tempCh, "functionalAtoms") == 0) {
            for (i = 0; i < numLine; ++i) {
                inFile.getline(tmpLine, 1000);
                tmpStr = tmpLine;
                strVec.clear();
                split(tmpStr, ' ', strVec);
                tmpInt = 2;
                for (j = 2; j < strVec.size(); ++j) {
                    tmpStr = strVec[0];
                    tmpStr = tmpStr + strVec[j];
                    siItr = AtomMap.find(tmpStr);
                    if (siItr == AtomMap.end()) {
                        cout << "atom type error in reading functional atoms! " << i << " " << j << " " << tmpStr <<
                        endl;
                        exit(0);
                    }
                    tmpInt = siItr->second;
                    funcAtom[i].push_back(tmpInt);
                }
            }
        }
        else {
            continue;
        }
    }

    // set backbone size
    bb_size = 1.93;
    // initialize functional group atoms

}